

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O0

int Abs_GiaCheckTruth(word *pTruth,int nSize,int nSize0)

{
  int iVar1;
  int local_3c;
  int local_34;
  int nSteps;
  int k;
  int i;
  int nStr;
  uchar *pStr;
  int nSize0_local;
  int nSize_local;
  word *pTruth_local;
  
  if (nSize < 3) {
    local_3c = 1;
  }
  else {
    local_3c = 1 << ((char)nSize - 3U & 0x1f);
  }
  if ((nSize0 < 1) || (nSize < nSize0)) {
    __assert_fail("nSize0 > 0 && nSize0 <= nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                  ,0x27a,"int Abs_GiaCheckTruth(word *, int, int)");
  }
  if (nSize0 == 1) {
    for (nSteps = 0; nSteps < local_3c; nSteps = nSteps + 1) {
      if (((*(byte *)((long)pTruth + (long)nSteps) ^ *(byte *)((long)pTruth + (long)nSteps) >> 1) &
          0x55) != 0x55) {
        return 0;
      }
    }
    pTruth_local._4_4_ = 1;
  }
  else if (nSize0 == 2) {
    for (nSteps = 0; nSteps < local_3c; nSteps = nSteps + 1) {
      if (((((*(byte *)((long)pTruth + (long)nSteps) & 0xf) == 0) ||
           (*(byte *)((long)pTruth + (long)nSteps) >> 4 == 0)) ||
          ((*(byte *)((long)pTruth + (long)nSteps) & 0xf) == 0xf)) ||
         (*(byte *)((long)pTruth + (long)nSteps) >> 4 == 0xf)) {
        return 0;
      }
    }
    pTruth_local._4_4_ = 1;
  }
  else {
    if (nSize0 < 3) {
      __assert_fail("nSize0 >= 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                    ,0x28a,"int Abs_GiaCheckTruth(word *, int, int)");
    }
    iVar1 = 1 << ((char)nSize0 - 3U & 0x1f);
    for (nSteps = 0; nSteps < local_3c; nSteps = iVar1 + nSteps) {
      local_34 = 0;
      while ((local_34 < iVar1 && (*(char *)((long)pTruth + (long)(nSteps + local_34)) == '\0'))) {
        local_34 = local_34 + 1;
      }
      if (local_34 == iVar1) break;
      local_34 = 0;
      while ((local_34 < iVar1 && (*(char *)((long)pTruth + (long)(nSteps + local_34)) == -1))) {
        local_34 = local_34 + 1;
      }
      if (local_34 == iVar1) break;
    }
    if (local_3c < nSteps) {
      __assert_fail("i <= nStr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                    ,0x299,"int Abs_GiaCheckTruth(word *, int, int)");
    }
    pTruth_local._4_4_ = (uint)(nSteps == local_3c);
  }
  return pTruth_local._4_4_;
}

Assistant:

int Abs_GiaCheckTruth( word * pTruth, int nSize, int nSize0 )
{
    unsigned char * pStr = (unsigned char *)pTruth;
    int nStr = (nSize >= 3 ? (1 << (nSize - 3)) : 1);
    int i, k, nSteps;
    assert( nSize0 > 0 && nSize0 <= nSize );
    if ( nSize0 == 1 )
    {
        for ( i = 0; i < nStr; i++ )
            if ( (((unsigned)pStr[i] ^ ((unsigned)pStr[i] >> 1)) & 0x55) != 0x55 )
                return 0;
        return 1;
    }
    if ( nSize0 == 2 )
    {
        for ( i = 0; i < nStr; i++ )
            if ( ((unsigned)pStr[i] & 0xF) == 0x0 || (((unsigned)pStr[i] >> 4) & 0xF) == 0x0 || 
                 ((unsigned)pStr[i] & 0xF) == 0xF || (((unsigned)pStr[i] >> 4) & 0xF) == 0xF  )
                return 0;
        return 1;
    }
    assert( nSize0 >= 3 );
    nSteps = (1 << (nSize0 - 3));
    for ( i = 0; i < nStr; i += nSteps )
    {
        for ( k = 0; k < nSteps; k++ )
            if ( ((unsigned)pStr[i+k] & 0xFF) != 0x00 )
                break;
        if ( k == nSteps )
            break;
        for ( k = 0; k < nSteps; k++ )
            if ( ((unsigned)pStr[i+k] & 0xFF) != 0xFF )
                break;
        if ( k == nSteps )
            break;
    }
    assert( i <= nStr );
    return (int)( i == nStr );
}